

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinject.h
# Opt level: O0

shared_ptr<Arms> __thiscall
cinject::InstanceStorage<Arms,_cinject::ConstructorFactory<Arms,_void>_>::getInstance
          (InstanceStorage<Arms,_cinject::ConstructorFactory<Arms,_void>_> *this,
          InjectionContext *context)

{
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<Arms> sVar3;
  undefined1 local_30 [24];
  InjectionContext *context_local;
  InstanceStorage<Arms,_cinject::ConstructorFactory<Arms,_void>_> *this_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  context_local = context;
  this_local = this;
  if (((ulong)(context->componentStack_).
              super__Vector_base<cinject::component_type,_std::allocator<cinject::component_type>_>.
              _M_impl.super__Vector_impl_data._M_start & 0x100) == 0) {
    sVar3 = createInstance(this,context);
    _Var2 = sVar3.super___shared_ptr<Arms,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  else {
    bVar1 = std::operator==((shared_ptr<Arms> *)
                            &(context->componentStack_).
                             super__Vector_base<cinject::component_type,_std::allocator<cinject::component_type>_>
                             ._M_impl.super__Vector_impl_data._M_finish,(nullptr_t)0x0);
    if (bVar1) {
      createInstance((InstanceStorage<Arms,_cinject::ConstructorFactory<Arms,_void>_> *)local_30,
                     context);
      std::shared_ptr<Arms>::operator=
                ((shared_ptr<Arms> *)
                 &(context->componentStack_).
                  super__Vector_base<cinject::component_type,_std::allocator<cinject::component_type>_>
                  ._M_impl.super__Vector_impl_data._M_finish,(shared_ptr<Arms> *)local_30);
      std::shared_ptr<Arms>::~shared_ptr((shared_ptr<Arms> *)local_30);
    }
    std::shared_ptr<Arms>::shared_ptr
              ((shared_ptr<Arms> *)this,
               (shared_ptr<Arms> *)
               &(context->componentStack_).
                super__Vector_base<cinject::component_type,_std::allocator<cinject::component_type>_>
                ._M_impl.super__Vector_impl_data._M_finish);
    _Var2._M_pi = extraout_RDX;
  }
  sVar3.super___shared_ptr<Arms,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  sVar3.super___shared_ptr<Arms,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Arms>)sVar3.super___shared_ptr<Arms,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<TImplementation> getInstance(InjectionContext* context)
    {
        if (!isSingleton_)
        {
            return createInstance(context);
        }

        if (instance_ == nullptr)
        {
            instance_ = createInstance(context);
        }

        return instance_;
    }